

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall t_javame_generator::init_generator(t_javame_generator *this)

{
  t_program *this_00;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  int local_24c;
  undefined1 local_248 [4];
  int r_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int local_19c;
  undefined1 local_198 [4];
  int r_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  long local_138;
  size_type loc;
  string subdir;
  string dir;
  string local_e8;
  string local_c8;
  undefined1 local_a6;
  allocator local_a5 [13];
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_javame_generator *ptStack_10;
  int r;
  t_javame_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(pcVar2,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar1;
  if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
    local_a6 = 1;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_98);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar2,local_a5);
    std::operator+(&local_58,&local_78,": ");
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::operator+(pbVar4,&local_58,pcVar2);
    local_a6 = 0;
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"java",(allocator *)(dir.field_2._M_local_buf + 0xf));
  t_program::get_namespace(&local_c8,this_00,&local_e8);
  std::__cxx11::string::operator=((string *)&this->package_name_,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string
            ((string *)(subdir.field_2._M_local_buf + 8),(string *)&this->package_name_);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&loc);
  while( true ) {
    local_138 = std::__cxx11::string::find(subdir.field_2._M_local_buf + 8,0x4e5538);
    if (local_138 == -1) {
      lVar5 = std::__cxx11::string::size();
      if (lVar5 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,"/"
                      );
        std::operator+(&local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&subdir.field_2 + 8));
        std::__cxx11::string::operator=((string *)&loc,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)local_248);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        local_24c = mkdir(pcVar2,0x1ff);
        if ((local_24c == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_290,pcVar2,&local_291);
          std::operator+(&local_270,&local_290,": ");
          piVar3 = __errno_location();
          pcVar2 = strerror(*piVar3);
          std::operator+(pbVar4,&local_270,pcVar2);
          __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      std::__cxx11::string::operator=((string *)&this->package_dir_,(string *)&loc);
      std::__cxx11::string::~string((string *)&loc);
      std::__cxx11::string::~string((string *)(subdir.field_2._M_local_buf + 8));
      return;
    }
    std::operator+(&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,"/");
    std::__cxx11::string::substr((ulong)local_198,(ulong)((long)&subdir.field_2 + 8));
    std::operator+(&local_158,&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    std::__cxx11::string::operator=((string *)&loc,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)&local_178);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_19c = mkdir(pcVar2,0x1ff);
    if ((local_19c == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) break;
    std::__cxx11::string::substr((ulong)local_208,(ulong)((long)&subdir.field_2 + 8));
    std::__cxx11::string::operator=((string *)(subdir.field_2._M_local_buf + 8),local_208);
    std::__cxx11::string::~string(local_208);
  }
  local_1e2 = 1;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,pcVar2,&local_1e1);
  std::operator+(&local_1c0,&local_1e0,": ");
  piVar3 = __errno_location();
  pcVar2 = strerror(*piVar3);
  std::operator+(pbVar4,&local_1c0,pcVar2);
  local_1e2 = 0;
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_javame_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());
  package_name_ = program_->get_namespace("java");

  string dir = package_name_;
  string subdir = get_out_dir();
  string::size_type loc;
  while ((loc = dir.find(".")) != string::npos) {
    subdir = subdir + "/" + dir.substr(0, loc);
    MKDIR(subdir.c_str());
    dir = dir.substr(loc + 1);
  }
  if (dir.size() > 0) {
    subdir = subdir + "/" + dir;
    MKDIR(subdir.c_str());
  }

  package_dir_ = subdir;
}